

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::
parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,bool>
          (result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *rslt)

{
  bool bVar1;
  value_type *pvVar2;
  error_type *this_00;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  pair<bool,_toml::detail::region> local_110;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> local_c0;
  success<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_> local_78;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comments;
  result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_local;
  
  comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::is_ok((result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this);
  if (bVar1) {
    pvVar2 = result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::as_ok((result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this);
    region::comments_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30,&pvVar2->second);
    pvVar2 = result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::as_ok((result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this);
    std::pair<bool,_toml::detail::region>::pair(&local_110,pvVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_128,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
    basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value<bool,_nullptr>
              (&local_c0,&local_110,&local_128);
    ok<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
              (&local_78,(toml *)&local_c0,v);
    result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_78);
    success<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>::~success
              (&local_78);
    basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value(&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    std::pair<bool,_toml::detail::region>::~pair(&local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_30);
  }
  else {
    this_00 = result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::as_err((result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this);
    err<std::__cxx11::string>(&local_158,(toml *)this_00,v_00);
    result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_158);
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure(&local_158);
  }
  return __return_storage_ptr__;
}

Assistant:

result<Value, std::string>
parse_value_helper(result<std::pair<T, region>, std::string> rslt)
{
    if(rslt.is_ok())
    {
        auto comments = rslt.as_ok().second.comments();
        return ok(Value(std::move(rslt.as_ok()), std::move(comments)));
    }
    else
    {
        return err(std::move(rslt.as_err()));
    }
}